

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comp.c
# Opt level: O2

int comp_method_none_decomp
              (LIBSSH2_SESSION *session,uchar **dest,size_t *dest_len,size_t payload_limit,
              uchar *src,size_t src_len,void **abstract)

{
  *dest = src;
  *dest_len = src_len;
  return 0;
}

Assistant:

static int
comp_method_none_decomp(LIBSSH2_SESSION * session,
                        unsigned char **dest,
                        size_t *dest_len,
                        size_t payload_limit,
                        const unsigned char *src,
                        size_t src_len, void **abstract)
{
    (void) session;
    (void) payload_limit;
    (void) abstract;
    *dest = (unsigned char *) src;
    *dest_len = src_len;
    return 0;
}